

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QPalette __thiscall QMdiSubWindowPrivate::desktopPalette(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  QPalette *pQVar1;
  long *plVar2;
  undefined8 extraout_RDX;
  long in_RSI;
  ColorGroup CVar3;
  long in_FS_OFFSET;
  QPalette QVar4;
  QBrush local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)(in_RSI + 8);
  *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QWidgetPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QWidget::palette(this_00);
  QPalette::QPalette((QPalette *)this,pQVar1);
  CVar3 = (ColorGroup)this;
  plVar2 = (long *)QPalette::brush(CVar3,WindowText);
  QBrush::QBrush(local_20,(QColor *)(*plVar2 + 8),SolidPattern);
  QPalette::setBrush(CVar3,WindowText,(QBrush *)0xc);
  QBrush::~QBrush(local_20);
  plVar2 = (long *)QPalette::brush(CVar3,WindowText);
  QBrush::QBrush(local_20,(QColor *)(*plVar2 + 8),SolidPattern);
  QPalette::setBrush(CVar3,WindowText,(QBrush *)0x9);
  QBrush::~QBrush(local_20);
  plVar2 = (long *)QPalette::brush(CVar3,Light);
  QBrush::QBrush(local_20,(QColor *)(*plVar2 + 8),SolidPattern);
  QPalette::setBrush(CVar3,Light,(QBrush *)0xc);
  QBrush::~QBrush(local_20);
  plVar2 = (long *)QPalette::brush(CVar3,Light);
  QBrush::QBrush(local_20,(QColor *)(*plVar2 + 8),SolidPattern);
  QPalette::setBrush(CVar3,Light,(QBrush *)0x9);
  QBrush::~QBrush(local_20);
  plVar2 = (long *)QPalette::brush(CVar3,Light);
  QBrush::QBrush(local_20,(QColor *)(*plVar2 + 8),SolidPattern);
  QPalette::setBrush(CVar3,Light,(QBrush *)0xd);
  QBrush::~QBrush(local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar4._8_8_ = extraout_RDX;
    QVar4.d = (QPalettePrivate *)this;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QMdiSubWindowPrivate::desktopPalette() const
{
    Q_Q(const QMdiSubWindow);
    QPalette newPalette = q->palette();

    newPalette.setColor(QPalette::Active, QPalette::Highlight,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Active, QPalette::Base,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Inactive, QPalette::Highlight,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::Base,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::HighlightedText,
                        newPalette.color(QPalette::Inactive, QPalette::Window));

    return newPalette;
}